

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

any * __thiscall
nonstd::any_lite::any::operator=
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  any local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  any *this_local;
  
  local_18 = value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  any<std::__cxx11::string>(&local_20,value);
  swap(&local_20,this);
  ~any(&local_20);
  return this;
}

Assistant:

any & operator=( ValueType const & value )
    {
        any( value ).swap( *this );
        return *this;
    }